

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ack_thread.cc
# Opt level: O2

void __thiscall
AckThread::AddSession(AckThread *this,uint32_t session_id,string *dst_ip,uint16_t dst_port)

{
  mapped_type *this_00;
  WaitAckSession w;
  uint32_t local_6c;
  WaitAckSession local_68;
  
  local_6c = session_id;
  WaitAckSession::WaitAckSession(&local_68,session_id,dst_ip,dst_port);
  pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  this_00 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_AckThread::WaitAckSession>,_std::allocator<std::pair<const_unsigned_int,_AckThread::WaitAckSession>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_AckThread::WaitAckSession>,_std::allocator<std::pair<const_unsigned_int,_AckThread::WaitAckSession>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->_wait_ack_sessions,&local_6c);
  WaitAckSession::operator=(this_00,&local_68);
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  WaitAckSession::~WaitAckSession(&local_68);
  return;
}

Assistant:

void AckThread::AddSession(uint32_t session_id, std::string &dst_ip, uint16_t dst_port)
{
	WaitAckSession w(session_id, dst_ip, dst_port);
	dd::AutoLock lock(_lock);
	_wait_ack_sessions[session_id] = w;
}